

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void client_set_unfocused(natwm_state *state,client *client)

{
  theme *ptVar1;
  theme *theme;
  client *client_local;
  natwm_state *state_local;
  
  if ((client != (client *)0x0) && ((client->state & CLIENT_HIDDEN) == 0)) {
    ptVar1 = state->workspace_list->theme;
    client->is_focused = false;
    button_binding_grab(state,client->window,&client_focus_event);
    update_theme(state,client,ptVar1->border_width->focused);
  }
  return;
}

Assistant:

void client_set_unfocused(const struct natwm_state *state, struct client *client)
{
        if (client == NULL || client->state & CLIENT_HIDDEN) {
                return;
        }

        struct theme *theme = state->workspace_list->theme;

        client->is_focused = false;

        // When a client is unfocused we need to grab the mouse button required
        // for "click to focus"
        button_binding_grab(state, client->window, &client_focus_event);

        update_theme(state, client, theme->border_width->focused);
}